

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void ERR_error_string_n(ulong e,char *buf,size_t len)

{
  uint uVar1;
  char *pcVar2;
  size_t __n;
  ulong uVar3;
  char *pcVar4;
  char reason_buf [32];
  char lib_buf [32];
  
  if (len != 0) {
    uVar1 = (uint)e;
    uVar3 = e >> 0x18 & 0xff;
    if (uVar1 < 0x23000000) {
      pcVar4 = kLibraryNames[uVar3].str;
    }
    else {
      pcVar4 = (char *)0x0;
    }
    pcVar2 = err_reason_error_string(uVar1,0);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = lib_buf;
      snprintf(pcVar4,0x20,"lib(%u)",uVar3);
    }
    if (pcVar2 == (char *)0x0) {
      snprintf(reason_buf,0x20,"reason(%u)",(ulong)(uVar1 & 0xfff));
      pcVar2 = reason_buf;
    }
    uVar1 = snprintf(buf,len,"error:%08x:%s:OPENSSL_internal:%s",e & 0xffffffff,pcVar4,pcVar2);
    if (((4 < len) && (-1 < (int)uVar1)) && (len <= uVar1)) {
      pcVar4 = buf + (len - 5);
      __n = 4;
      while (__n != 0) {
        pcVar2 = strchr(buf,0x3a);
        if ((pcVar2 == (char *)0x0) || (pcVar4 < pcVar2)) {
          memset(pcVar4,0x3a,__n);
          return;
        }
        buf = pcVar2 + 1;
        pcVar4 = pcVar4 + 1;
        __n = __n - 1;
      }
    }
  }
  return;
}

Assistant:

char *ERR_error_string_n(uint32_t packed_error, char *buf, size_t len) {
  if (len == 0) {
    return NULL;
  }

  unsigned lib = ERR_GET_LIB(packed_error);
  unsigned reason = ERR_GET_REASON(packed_error);

  const char *lib_str = err_lib_error_string(packed_error);
  const char *reason_str = err_reason_error_string(packed_error, /*symbol=*/0);

  char lib_buf[32], reason_buf[32];
  if (lib_str == NULL) {
    snprintf(lib_buf, sizeof(lib_buf), "lib(%u)", lib);
    lib_str = lib_buf;
  }

  if (reason_str == NULL) {
    snprintf(reason_buf, sizeof(reason_buf), "reason(%u)", reason);
    reason_str = reason_buf;
  }

  int ret = snprintf(buf, len, "error:%08" PRIx32 ":%s:OPENSSL_internal:%s",
                     packed_error, lib_str, reason_str);
  if (ret >= 0 && (size_t)ret >= len) {
    // The output was truncated; make sure we always have 5 colon-separated
    // fields, i.e. 4 colons.
    static const unsigned num_colons = 4;
    unsigned i;
    char *s = buf;

    if (len <= num_colons) {
      // In this situation it's not possible to ensure that the correct number
      // of colons are included in the output.
      return buf;
    }

    for (i = 0; i < num_colons; i++) {
      char *colon = strchr(s, ':');
      char *last_pos = &buf[len - 1] - num_colons + i;

      if (colon == NULL || colon > last_pos) {
        // set colon |i| at last possible position (buf[len-1] is the
        // terminating 0). If we're setting this colon, then all whole of the
        // rest of the string must be colons in order to have the correct
        // number.
        OPENSSL_memset(last_pos, ':', num_colons - i);
        break;
      }

      s = colon + 1;
    }
  }

  return buf;
}